

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void AddBit(int bit,uchar *bp,uchar **out,size_t *outsize)

{
  ulong *in_RCX;
  long *in_RDX;
  byte *in_RSI;
  int in_EDI;
  undefined8 local_28;
  
  if (*in_RSI == 0) {
    if ((*in_RCX & *in_RCX - 1) == 0) {
      if (*in_RCX == 0) {
        local_28 = malloc(1);
      }
      else {
        local_28 = realloc((void *)*in_RDX,*in_RCX << 1);
      }
      *in_RDX = (long)local_28;
    }
    *(undefined1 *)(*in_RDX + *in_RCX) = 0;
    *in_RCX = *in_RCX + 1;
  }
  *(byte *)(*in_RDX + (*in_RCX - 1)) =
       *(byte *)(*in_RDX + (*in_RCX - 1)) | (byte)(in_EDI << (*in_RSI & 0x1f));
  *in_RSI = *in_RSI + 1 & 7;
  return;
}

Assistant:

static void AddBit(int bit,
                   unsigned char* bp, unsigned char** out, size_t* outsize) {
  if (*bp == 0) ZOPFLI_APPEND_DATA(0, out, outsize);
  (*out)[*outsize - 1] |= bit << *bp;
  *bp = (*bp + 1) & 7;
}